

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O1

void __thiscall FFont::Preload(FFont *this)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  uint uVar3;
  int foo;
  undefined8 uStack_28;
  
  uVar1 = this->FirstChar;
  uStack_28 = (ulong)uVar1;
  if (uVar1 != this->LastChar) {
    uVar3 = 0x21;
    if (0x21 < (int)uVar1) {
      uVar3 = uVar1;
    }
    iVar2 = this->LastChar;
    if (0x7d < iVar2) {
      iVar2 = 0x7e;
    }
    if ((int)uVar3 < iVar2) {
      do {
        iVar2 = (*this->_vptr_FFont[2])(this,(ulong)uVar3,(long)&uStack_28 + 4);
        if ((FTexture *)CONCAT44(extraout_var,iVar2) != (FTexture *)0x0) {
          FTexture::GetNative((FTexture *)CONCAT44(extraout_var,iVar2),false);
        }
        uVar3 = uVar3 + 1;
        iVar2 = this->LastChar;
        if (0x7d < iVar2) {
          iVar2 = 0x7e;
        }
      } while ((int)uVar3 < iVar2);
    }
  }
  return;
}

Assistant:

void FFont::Preload() const
{
	// First and last char are the same? Wait until it's actually needed
	// since nothing is gained by preloading now.
	if (FirstChar == LastChar)
	{
		return;
	}
	for (int i = MAX(FirstChar, 0x21); i < MIN(LastChar, 0x7e); ++i)
	{
		int foo;
		FTexture *pic = GetChar(i, &foo);
		if (pic != NULL)
		{
			pic->GetNative(false);
		}
	}
}